

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vao.cpp
# Opt level: O3

VertexAndFaceArraysPtr __thiscall
graphics101::vao::makeSquare(vao *this,GLint position_location,GLint texcoord_location)

{
  int iVar1;
  GLfloat *data;
  undefined1 data_00 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  VertexAndFaceArraysPtr VVar3;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  TC;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  V;
  vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
  F;
  undefined1 local_88 [8];
  vec<2,_float,_(glm::qualifier)0> *pvStack_80;
  vec<2,_float,_(glm::qualifier)0> *local_78;
  GLfloat *local_68;
  iterator iStack_60;
  vec<3,_float,_(glm::qualifier)0> *local_58;
  vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
  local_48;
  vec<3,_int,_(glm::qualifier)0> local_2c;
  
  local_68 = (GLfloat *)0x0;
  iStack_60._M_current = (vec<3,_float,_(glm::qualifier)0> *)0x0;
  local_58 = (vec<3,_float,_(glm::qualifier)0> *)0x0;
  local_88._0_4_ = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0xbf800000;
  local_88._4_4_ = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0xbf800000;
  pvStack_80 = (vec<2,_float,_(glm::qualifier)0> *)((ulong)pvStack_80 & 0xffffffff00000000);
  std::
  vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>::
  _M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
            ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
              *)&local_68,(iterator)0x0,(vec<3,_float,_(glm::qualifier)0> *)local_88);
  local_88._0_4_ = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3f800000;
  local_88._4_4_ = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0xbf800000;
  pvStack_80 = (vec<2,_float,_(glm::qualifier)0> *)((ulong)pvStack_80 & 0xffffffff00000000);
  if (iStack_60._M_current == local_58) {
    std::
    vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
    ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
              ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                *)&local_68,iStack_60,(vec<3,_float,_(glm::qualifier)0> *)local_88);
  }
  else {
    ((iStack_60._M_current)->field_2).z = 0.0;
    (iStack_60._M_current)->field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3f800000;
    (iStack_60._M_current)->field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0xbf800000;
    iStack_60._M_current = iStack_60._M_current + 1;
  }
  local_88._0_4_ = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3f800000;
  local_88._4_4_ = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3f800000;
  pvStack_80 = (vec<2,_float,_(glm::qualifier)0> *)((ulong)pvStack_80 & 0xffffffff00000000);
  if (iStack_60._M_current == local_58) {
    std::
    vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
    ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
              ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                *)&local_68,iStack_60,(vec<3,_float,_(glm::qualifier)0> *)local_88);
  }
  else {
    ((iStack_60._M_current)->field_2).z = 0.0;
    (iStack_60._M_current)->field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3f800000;
    (iStack_60._M_current)->field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3f800000;
    iStack_60._M_current = iStack_60._M_current + 1;
  }
  local_88._0_4_ = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0xbf800000;
  local_88._4_4_ = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3f800000;
  pvStack_80 = (vec<2,_float,_(glm::qualifier)0> *)((ulong)pvStack_80 & 0xffffffff00000000);
  if (iStack_60._M_current == local_58) {
    std::
    vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
    ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
              ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                *)&local_68,iStack_60,(vec<3,_float,_(glm::qualifier)0> *)local_88);
  }
  else {
    ((iStack_60._M_current)->field_2).z = 0.0;
    (iStack_60._M_current)->field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0xbf800000;
    (iStack_60._M_current)->field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3f800000;
    iStack_60._M_current = iStack_60._M_current + 1;
  }
  local_78 = (vec<2,_float,_(glm::qualifier)0> *)0x0;
  local_88 = (undefined1  [8])0x0;
  pvStack_80 = (vec<2,_float,_(glm::qualifier)0> *)0x0;
  local_48.
  super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::
  vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>::
  _M_realloc_insert<glm::vec<2,float,(glm::qualifier)0>>
            ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
              *)local_88,(iterator)0x0,(vec<2,_float,_(glm::qualifier)0> *)&local_48);
  local_48.
  super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f800000;
  if (pvStack_80 == local_78) {
    std::
    vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
    ::_M_realloc_insert<glm::vec<2,float,(glm::qualifier)0>>
              ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
                *)local_88,(iterator)pvStack_80,(vec<2,_float,_(glm::qualifier)0> *)&local_48);
  }
  else {
    pvStack_80->field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x3f800000
    ;
    pvStack_80->field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
    pvStack_80 = pvStack_80 + 1;
  }
  local_48.
  super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f8000003f800000;
  if (pvStack_80 == local_78) {
    std::
    vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
    ::_M_realloc_insert<glm::vec<2,float,(glm::qualifier)0>>
              ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
                *)local_88,(iterator)pvStack_80,(vec<2,_float,_(glm::qualifier)0> *)&local_48);
  }
  else {
    pvStack_80->field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x3f800000
    ;
    pvStack_80->field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x3f800000
    ;
    pvStack_80 = pvStack_80 + 1;
  }
  local_48.
  super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f80000000000000;
  if (pvStack_80 == local_78) {
    std::
    vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
    ::_M_realloc_insert<glm::vec<2,float,(glm::qualifier)0>>
              ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
                *)local_88,(iterator)pvStack_80,(vec<2,_float,_(glm::qualifier)0> *)&local_48);
  }
  else {
    pvStack_80->field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
    pvStack_80->field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x3f800000
    ;
    pvStack_80 = pvStack_80 + 1;
  }
  local_48.
  super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (vec<3,_int,_(glm::qualifier)0> *)0x0;
  local_48.
  super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (vec<3,_int,_(glm::qualifier)0> *)0x0;
  local_2c.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_int,_(glm::qualifier)0>_3)0x0;
  local_2c.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_int,_(glm::qualifier)0>_5)0x1;
  local_2c.field_2.z = 2;
  std::vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>::
  _M_realloc_insert<glm::vec<3,int,(glm::qualifier)0>>
            ((vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
              *)&local_48,(iterator)0x0,&local_2c);
  local_2c.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_int,_(glm::qualifier)0>_3)0x0;
  local_2c.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_int,_(glm::qualifier)0>_5)0x2;
  local_2c.field_2.z = 3;
  if (local_48.
      super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_48.
      super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
    ::_M_realloc_insert<glm::vec<3,int,(glm::qualifier)0>>
              ((vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
                *)&local_48,
               (iterator)
               local_48.
               super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_2c);
  }
  else {
    ((local_48.
      super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->field_2).z = 3;
    (local_48.
     super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)->field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_int,_(glm::qualifier)0>_3)0x0;
    (local_48.
     super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)->field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_int,_(glm::qualifier)0>_5)0x2;
    local_48.
    super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_48.
         super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  *(undefined8 *)this = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<graphics101::VertexAndFaceArrays,std::allocator<graphics101::VertexAndFaceArrays>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),(VertexAndFaceArrays **)this,
             (allocator<graphics101::VertexAndFaceArrays> *)&local_2c);
  iVar1 = (int)((ulong)((long)iStack_60._M_current - (long)local_68) >> 2) * -0x55555555;
  data = (GLfloat *)0x0;
  if (0 < iVar1) {
    data = local_68;
  }
  anon_unknown.dwarf_159e1e::upload_attribute(**(GLuint **)this,3,data,iVar1,position_location);
  iVar1 = (int)((ulong)((long)pvStack_80 - (long)local_88) >> 3);
  data_00 = (undefined1  [8])(GLfloat *)0x0;
  if (0 < iVar1) {
    data_00 = local_88;
  }
  anon_unknown.dwarf_159e1e::upload_attribute
            (**(GLuint **)this,2,(GLfloat *)data_00,iVar1,texcoord_location);
  VertexAndFaceArrays::uploadFaces(*(VertexAndFaceArrays **)this,&local_48,4);
  _Var2._M_pi = extraout_RDX;
  if ((vec<2,_float,_(glm::qualifier)0>)
      local_48.
      super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (vec<2,_float,_(glm::qualifier)0>)0x0) {
    operator_delete(local_48.
                    super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    _Var2._M_pi = extraout_RDX_00;
  }
  if (local_88 != (undefined1  [8])0x0) {
    operator_delete((void *)local_88);
    _Var2._M_pi = extraout_RDX_01;
  }
  if (local_68 != (GLfloat *)0x0) {
    operator_delete(local_68);
    _Var2._M_pi = extraout_RDX_02;
  }
  VVar3.super___shared_ptr<graphics101::VertexAndFaceArrays,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var2._M_pi;
  VVar3.super___shared_ptr<graphics101::VertexAndFaceArrays,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (VertexAndFaceArraysPtr)
         VVar3.super___shared_ptr<graphics101::VertexAndFaceArrays,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

VertexAndFaceArrays::VertexAndFaceArraysPtr makeSquare( GLint position_location, GLint texcoord_location )
{
    std::vector< vec3 > V;
    V.push_back( vec3( -1, -1, 0 ) );
    V.push_back( vec3(  1, -1, 0 ) );
    V.push_back( vec3(  1,  1, 0 ) );
    V.push_back( vec3( -1,  1, 0 ) );
    
    std::vector< vec2 > TC;
    TC.push_back( vec2( 0, 0 ) );
    TC.push_back( vec2( 1, 0 ) );
    TC.push_back( vec2( 1, 1 ) );
    TC.push_back( vec2( 0, 1 ) );
    
    std::vector< ivec3 > F;
    F.push_back( ivec3( 0, 1, 2 ) );
    F.push_back( ivec3( 0, 2, 3 ) );
    
    auto vao = VertexAndFaceArrays::makePtr();
    vao->uploadAttribute( V, position_location );
    vao->uploadAttribute( TC, texcoord_location );
    vao->uploadFaces( F );
    return vao;
}